

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecfloat.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vec4f *v)

{
  ostream *poVar1;
  float *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[3]);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream& operator << (std::ostream& os, const vec4f& v) {
	return os << '(' << v.x << ',' << v.y << ',' << v.z << ',' << v.w << ')';
}